

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O3

parser_error parse_prefs_object(parser *p)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  char *pcVar4;
  char *name;
  object_kind *poVar5;
  flavor *pfVar6;
  long lVar7;
  ulong uVar8;
  angband_constants *paVar9;
  
  pcVar4 = (char *)parser_priv(p);
  if (pcVar4 == (char *)0x0) {
    __assert_fail("d != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-prefs.c"
                  ,0x260,"enum parser_error parse_prefs_object(struct parser *)");
  }
  if (*pcVar4 == '\0') {
    pcVar4 = parser_getsym(p,"tval");
    name = parser_getsym(p,"sval");
    if ((*pcVar4 == '*') && (pcVar4[1] == '\0')) {
      wVar1 = parser_getint(p,"attr");
      wVar2 = parser_getint(p,"char");
      if (*name != '*') {
        return PARSE_ERROR_UNRECOGNISED_SVAL;
      }
      if (name[1] != '\0') {
        return PARSE_ERROR_UNRECOGNISED_SVAL;
      }
      pfVar6 = flavors;
      if (z_info->k_max != 0) {
        lVar7 = 0x20;
        uVar8 = 0;
        do {
          poVar5 = k_info;
          kind_x_attr[*(uint *)(k_info->flags + lVar7 + -0x80)] = (uint8_t)wVar1;
          kind_x_char[*(uint *)(poVar5->flags + lVar7 + -0x80)] = wVar2;
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + 0x2c0;
          pfVar6 = flavors;
        } while (uVar8 < z_info->k_max);
      }
      for (; pfVar6 != (flavor *)0x0; pfVar6 = pfVar6->next) {
        flavor_x_attr[pfVar6->fidx] = (uint8_t)wVar1;
        flavor_x_char[pfVar6->fidx] = wVar2;
      }
    }
    else {
      wVar1 = tval_find_idx(pcVar4);
      if (wVar1 < L'\0') {
        return PARSE_ERROR_UNRECOGNISED_TVAL;
      }
      if ((*name == '*') && (name[1] == '\0')) {
        wVar2 = parser_getint(p,"attr");
        wVar3 = parser_getint(p,"char");
        pfVar6 = flavors;
        if (z_info->k_max != 0) {
          lVar7 = 0x20;
          uVar8 = 0;
          poVar5 = k_info;
          paVar9 = z_info;
          do {
            if (*(wchar_t *)(poVar5->flags + lVar7 + -0x7c) == wVar1) {
              kind_x_attr[*(uint *)(poVar5->flags + lVar7 + -0x80)] = (uint8_t)wVar2;
              kind_x_char[*(uint *)(poVar5->flags + lVar7 + -0x80)] = wVar3;
              poVar5 = k_info;
              paVar9 = z_info;
            }
            uVar8 = uVar8 + 1;
            lVar7 = lVar7 + 0x2c0;
            pfVar6 = flavors;
          } while (uVar8 < paVar9->k_max);
        }
        for (; pfVar6 != (flavor *)0x0; pfVar6 = pfVar6->next) {
          if (wVar1 == (uint)pfVar6->tval) {
            flavor_x_attr[pfVar6->fidx] = (uint8_t)wVar2;
            flavor_x_char[pfVar6->fidx] = wVar3;
          }
        }
      }
      else {
        wVar2 = lookup_sval(wVar1,name);
        if ((L'\xffffffff' < wVar2) &&
           (poVar5 = lookup_kind(wVar1,wVar2), poVar5 != (object_kind *)0x0)) {
          wVar1 = parser_getint(p,"attr");
          kind_x_attr[poVar5->kidx] = (uint8_t)wVar1;
          wVar1 = parser_getint(p,"char");
          kind_x_char[poVar5->kidx] = wVar1;
        }
      }
    }
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_prefs_object(struct parser *p)
{
	int tvi, svi;
	struct object_kind *kind;
	const char *tval, *sval;

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	tval = parser_getsym(p, "tval");
	sval = parser_getsym(p, "sval");
	if (streq(tval, "*")) {
		/* object:*:* means handle all objects and flavors */
		uint8_t attr = parser_getint(p, "attr");
		wchar_t chr = parser_getint(p, "char");
		size_t i;
		struct flavor *flavor;

		if (!streq(sval, "*"))
			return PARSE_ERROR_UNRECOGNISED_SVAL;

		for (i = 0; i < z_info->k_max; i++) {
			struct object_kind *kind_local = &k_info[i];

			kind_x_attr[kind_local->kidx] = attr;
			kind_x_char[kind_local->kidx] = chr;
		}

		for (flavor = flavors; flavor; flavor = flavor->next) {
			flavor_x_attr[flavor->fidx] = attr;
			flavor_x_char[flavor->fidx] = chr;
		}
	} else {
		tvi = tval_find_idx(tval);
		if (tvi < 0)
			return PARSE_ERROR_UNRECOGNISED_TVAL;

		/* object:tval:* means handle all objects and flavors with this tval */
		if (streq(sval, "*")) {
			uint8_t attr = parser_getint(p, "attr");
			wchar_t chr = parser_getint(p, "char");
			size_t i;
			struct flavor *flavor;

			for (i = 0; i < z_info->k_max; i++) {
				struct object_kind *kind_local = &k_info[i];

				if (kind_local->tval != tvi)
					continue;

				kind_x_attr[kind_local->kidx] = attr;
				kind_x_char[kind_local->kidx] = chr;
			}

			for (flavor = flavors; flavor; flavor = flavor->next)
				if (flavor->tval == tvi) {
					flavor_x_attr[flavor->fidx] = attr;
					flavor_x_char[flavor->fidx] = chr;
				}

		} else {
			/* No error at incorrect sval to stop failure due to outdated
			 * pref files and enable switching between old and new classes */
			svi = lookup_sval(tvi, sval);
			if (svi < 0)
				return PARSE_ERROR_NONE;

			kind = lookup_kind(tvi, svi);
			if (!kind)
				return PARSE_ERROR_NONE;

			kind_x_attr[kind->kidx] = (uint8_t)parser_getint(p, "attr");
			kind_x_char[kind->kidx] = (wchar_t)parser_getint(p, "char");
		}
	}

	return PARSE_ERROR_NONE;
}